

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O3

int secp256k1_ecmult_pippenger_batch
              (secp256k1_callback *error_callback,secp256k1_scratch *scratch,secp256k1_gej *r,
              secp256k1_scalar *inp_g_sc,secp256k1_ecmult_multi_callback *cb,void *cbdata,
              size_t n_points,size_t cb_offset)

{
  long lVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  secp256k1_ge *p1;
  secp256k1_scalar *s1;
  long *plVar11;
  void *pvVar12;
  ulong uVar13;
  secp256k1_gej *r_00;
  secp256k1_ge *psVar14;
  secp256k1_gej *psVar15;
  size_t checkpoint;
  secp256k1_scalar *s1_00;
  ulong uVar16;
  long lVar17;
  long lVar18;
  secp256k1_ge *psVar19;
  int *piVar20;
  long lVar21;
  ulong uVar22;
  byte bVar23;
  undefined1 auVar24 [16];
  secp256k1_gej running_sum;
  long local_130;
  long local_100;
  size_t local_f8;
  undefined1 local_b8 [32];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  uint64_t local_48;
  int local_40;
  
  bVar23 = 0;
  lVar10 = 0;
  do {
    if (scratch->magic[lVar10] != "scratch"[lVar10]) {
      (*error_callback->fn)("invalid scratch space",error_callback->data);
      checkpoint = 0;
      goto LAB_0016a1de;
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 8);
  checkpoint = scratch->alloc_size;
LAB_0016a1de:
  r->infinity = 1;
  (r->x).n[0] = 0;
  (r->x).n[1] = 0;
  (r->x).n[2] = 0;
  (r->x).n[3] = 0;
  *(undefined1 (*) [16])((r->x).n + 4) = (undefined1  [16])0x0;
  (r->y).n[1] = 0;
  (r->y).n[2] = 0;
  (r->y).n[3] = 0;
  (r->y).n[4] = 0;
  (r->z).n[0] = 0;
  (r->z).n[1] = 0;
  (r->z).n[2] = 0;
  (r->z).n[3] = 0;
  (r->z).n[4] = 0;
  iVar8 = 1;
  if (inp_g_sc != (secp256k1_scalar *)0x0 || n_points != 0) {
    lVar10 = n_points * 2 + 2;
    local_f8 = n_points;
    uVar7 = secp256k1_pippenger_bucket_window(n_points);
    p1 = (secp256k1_ge *)secp256k1_scratch_alloc(error_callback,scratch,lVar10 * 0x58);
    s1 = (secp256k1_scalar *)secp256k1_scratch_alloc(error_callback,scratch,lVar10 * 0x20);
    plVar11 = (long *)secp256k1_scratch_alloc(error_callback,scratch,0x10);
    if ((plVar11 != (long *)0x0 && s1 != (secp256k1_scalar *)0x0) && p1 != (secp256k1_ge *)0x0) {
      pvVar12 = secp256k1_scratch_alloc(error_callback,scratch,lVar10 * 0x10);
      plVar11[1] = (long)pvVar12;
      uVar13 = (ulong)(byte)(0x7f / (byte)(uVar7 + 1) + 1);
      pvVar12 = secp256k1_scratch_alloc(error_callback,scratch,lVar10 * uVar13 * 4);
      *plVar11 = (long)pvVar12;
      r_00 = (secp256k1_gej *)
             secp256k1_scratch_alloc(error_callback,scratch,0x80L << ((byte)uVar7 & 0x3f));
      if ((plVar11[1] != 0) && (r_00 != (secp256k1_gej *)0x0 && *plVar11 != 0)) {
        if (inp_g_sc == (secp256k1_scalar *)0x0) {
          lVar10 = 0;
        }
        else {
          uVar4 = inp_g_sc->d[0];
          uVar5 = inp_g_sc->d[1];
          uVar6 = inp_g_sc->d[3];
          s1->d[2] = inp_g_sc->d[2];
          s1->d[3] = uVar6;
          s1->d[0] = uVar4;
          s1->d[1] = uVar5;
          psVar14 = &secp256k1_ge_const_g;
          psVar19 = p1;
          for (lVar10 = 0xb; lVar10 != 0; lVar10 = lVar10 + -1) {
            (psVar19->x).n[0] = (psVar14->x).n[0];
            psVar14 = (secp256k1_ge *)((long)psVar14 + ((ulong)bVar23 * -2 + 1) * 8);
            psVar19 = (secp256k1_ge *)((long)psVar19 + (ulong)bVar23 * -0x10 + 8);
          }
          secp256k1_ecmult_endo_split(s1,s1 + 1,p1,p1 + 1);
          lVar10 = 2;
        }
        if (n_points != 0) {
          s1_00 = (secp256k1_scalar *)((long)s1->d + (ulong)(uint)((int)lVar10 << 5));
          psVar14 = p1 + lVar10;
          do {
            iVar8 = (*cb)(s1_00,psVar14,cb_offset,cbdata);
            if (iVar8 == 0) goto LAB_0016a340;
            secp256k1_ecmult_endo_split(s1_00,s1_00 + 1,psVar14,psVar14 + 1);
            lVar10 = lVar10 + 2;
            cb_offset = cb_offset + 1;
            s1_00 = s1_00 + 2;
            psVar14 = psVar14 + 2;
            local_f8 = local_f8 - 1;
          } while (local_f8 != 0);
        }
        if (lVar10 == 0) {
          r->infinity = 1;
          (r->x).n[0] = 0;
          (r->x).n[1] = 0;
          (r->x).n[2] = 0;
          (r->x).n[3] = 0;
          *(undefined1 (*) [16])((r->x).n + 4) = (undefined1  [16])0x0;
          (r->y).n[1] = 0;
          (r->y).n[2] = 0;
          (r->y).n[3] = 0;
          (r->y).n[4] = 0;
          (r->z).n[0] = 0;
          (r->z).n[1] = 0;
          (r->z).n[2] = 0;
          (r->z).n[3] = 0;
          (r->z).n[4] = 0;
        }
        else {
          piVar20 = &p1->infinity;
          lVar21 = 0;
          local_100 = 0;
          psVar14 = p1;
          do {
            auVar24._0_4_ = -(uint)((int)s1->d[2] == 0 && (int)s1->d[0] == 0);
            auVar24._4_4_ =
                 -(uint)(*(int *)((long)s1->d + 0x14) == 0 && *(int *)((long)s1->d + 4) == 0);
            auVar24._8_4_ = -(uint)((int)s1->d[3] == 0 && (int)s1->d[1] == 0);
            auVar24._12_4_ =
                 -(uint)(*(int *)((long)s1->d + 0x1c) == 0 && *(int *)((long)s1->d + 0xc) == 0);
            uVar9 = movmskps((int)psVar14,auVar24);
            psVar14 = (secp256k1_ge *)(ulong)(uVar9 ^ 0xf);
            if (((uVar9 ^ 0xf) != 0) && (*piVar20 == 0)) {
              *(long *)(plVar11[1] + 8 + local_100 * 0x10) = lVar21;
              uVar9 = secp256k1_wnaf_fixed((int *)(local_100 * uVar13 * 4 + *plVar11),s1,uVar7 + 1);
              psVar14 = (secp256k1_ge *)(ulong)uVar9;
              *(uint *)(plVar11[1] + local_100 * 0x10) = uVar9;
              local_100 = local_100 + 1;
            }
            lVar21 = lVar21 + 1;
            piVar20 = piVar20 + 0x16;
            s1 = s1 + 1;
          } while (lVar10 != lVar21);
          r->infinity = 1;
          (r->x).n[0] = 0;
          (r->x).n[1] = 0;
          (r->x).n[2] = 0;
          (r->x).n[3] = 0;
          *(undefined1 (*) [16])((r->x).n + 4) = (undefined1  [16])0x0;
          (r->y).n[1] = 0;
          (r->y).n[2] = 0;
          (r->y).n[3] = 0;
          (r->y).n[4] = 0;
          (r->z).n[0] = 0;
          (r->z).n[1] = 0;
          (r->z).n[2] = 0;
          (r->z).n[3] = 0;
          (r->z).n[4] = 0;
          if (local_100 != 0) {
            lVar18 = 1L << ((byte)uVar7 & 0x3f);
            auVar3._8_8_ = 0;
            auVar3._0_8_ = (ulong)uVar7 + 1;
            auVar3 = (ZEXT816(0) << 0x40 | ZEXT816(0x7f)) / auVar3;
            uVar16 = (ulong)(uint)(auVar3._0_4_ << 2);
            lVar10 = uVar16 + 4;
            uVar13 = (ulong)((int)lVar18 - 2);
            psVar15 = r_00;
            lVar21 = lVar18;
            local_130 = auVar3._0_8_;
            do {
              do {
                psVar15->infinity = 1;
                (psVar15->x).n[0] = 0;
                (psVar15->x).n[1] = 0;
                (psVar15->x).n[2] = 0;
                (psVar15->x).n[3] = 0;
                *(undefined1 (*) [16])((psVar15->x).n + 4) = (undefined1  [16])0x0;
                (psVar15->y).n[1] = 0;
                (psVar15->y).n[2] = 0;
                (psVar15->y).n[3] = 0;
                (psVar15->y).n[4] = 0;
                (psVar15->z).n[0] = 0;
                (psVar15->z).n[1] = 0;
                (psVar15->z).n[2] = 0;
                (psVar15->z).n[3] = 0;
                (psVar15->z).n[4] = 0;
                lVar21 = lVar21 + -1;
                psVar15 = psVar15 + 1;
              } while (lVar21 != 0);
              lVar17 = 8;
              uVar22 = uVar16;
              lVar21 = local_100;
              do {
                uVar9 = *(uint *)(*plVar11 + uVar22);
                lVar1 = *(long *)(plVar11[1] + lVar17);
                if ((local_130 == 0) && (*(int *)(plVar11[1] + -8 + lVar17) != 0)) {
                  secp256k1_ge_neg((secp256k1_ge *)local_b8,p1 + lVar1);
                  secp256k1_gej_add_ge_var(r_00,r_00,(secp256k1_ge *)local_b8,(secp256k1_fe *)0x0);
                }
                if ((int)uVar9 < 1) {
                  if ((int)uVar9 < 0) {
                    uVar9 = ~uVar9;
                    psVar14 = (secp256k1_ge *)local_b8;
                    secp256k1_ge_neg(psVar14,p1 + lVar1);
                    goto LAB_0016a653;
                  }
                }
                else {
                  uVar9 = uVar9 - 1;
                  psVar14 = p1 + lVar1;
LAB_0016a653:
                  secp256k1_gej_add_ge_var
                            (r_00 + (uVar9 >> 1),r_00 + (uVar9 >> 1),psVar14,(secp256k1_fe *)0x0);
                }
                lVar17 = lVar17 + 0x10;
                uVar22 = uVar22 + lVar10;
                lVar21 = lVar21 + -1;
              } while (lVar21 != 0);
              uVar9 = uVar7;
              do {
                if (r->infinity == 0) {
                  secp256k1_gej_double(r,r);
                }
                else {
                  r->infinity = 1;
                  (r->x).n[0] = 0;
                  (r->x).n[1] = 0;
                  (r->x).n[2] = 0;
                  (r->x).n[3] = 0;
                  *(undefined1 (*) [16])((r->x).n + 4) = (undefined1  [16])0x0;
                  (r->y).n[1] = 0;
                  (r->y).n[2] = 0;
                  (r->y).n[3] = 0;
                  (r->y).n[4] = 0;
                  (r->z).n[0] = 0;
                  (r->z).n[1] = 0;
                  (r->z).n[2] = 0;
                  (r->z).n[3] = 0;
                  (r->z).n[4] = 0;
                }
                uVar9 = uVar9 - 1;
              } while (uVar9 != 0);
              local_40 = 1;
              local_b8._0_16_ = (undefined1  [16])0x0;
              local_b8._16_16_ = (undefined1  [16])0x0;
              local_98 = (undefined1  [16])0x0;
              local_88 = (undefined1  [16])0x0;
              local_78 = (undefined1  [16])0x0;
              local_68 = (undefined1  [16])0x0;
              local_58 = (undefined1  [16])0x0;
              local_48 = 0;
              lVar21 = uVar13 + 2;
              psVar15 = r_00 + uVar13 + 1;
              do {
                secp256k1_gej_add_var
                          ((secp256k1_gej *)local_b8,(secp256k1_gej *)local_b8,psVar15,
                           (secp256k1_fe *)0x0);
                secp256k1_gej_add_var(r,r,(secp256k1_gej *)local_b8,(secp256k1_fe *)0x0);
                lVar21 = lVar21 + -1;
                psVar15 = psVar15 + -1;
              } while (1 < lVar21);
              secp256k1_gej_add_var
                        ((secp256k1_gej *)local_b8,(secp256k1_gej *)local_b8,r_00,
                         (secp256k1_fe *)0x0);
              if (r->infinity == 0) {
                secp256k1_gej_double(r,r);
              }
              else {
                r->infinity = 1;
                (r->x).n[0] = 0;
                (r->x).n[1] = 0;
                (r->x).n[2] = 0;
                (r->x).n[3] = 0;
                *(undefined1 (*) [16])((r->x).n + 4) = (undefined1  [16])0x0;
                (r->y).n[1] = 0;
                (r->y).n[2] = 0;
                (r->y).n[3] = 0;
                (r->y).n[4] = 0;
                (r->z).n[0] = 0;
                (r->z).n[1] = 0;
                (r->z).n[2] = 0;
                (r->z).n[3] = 0;
                (r->z).n[4] = 0;
              }
              secp256k1_gej_add_var(r,r,(secp256k1_gej *)local_b8,(secp256k1_fe *)0x0);
              uVar16 = uVar16 - 4;
              bVar2 = 0 < local_130;
              psVar15 = r_00;
              lVar21 = lVar18;
              local_130 = local_130 + -1;
            } while (bVar2);
          }
        }
        secp256k1_scratch_apply_checkpoint(error_callback,scratch,checkpoint);
        return 1;
      }
    }
LAB_0016a340:
    secp256k1_scratch_apply_checkpoint(error_callback,scratch,checkpoint);
    iVar8 = 0;
  }
  return iVar8;
}

Assistant:

static int secp256k1_ecmult_pippenger_batch(const secp256k1_callback* error_callback, secp256k1_scratch *scratch, secp256k1_gej *r, const secp256k1_scalar *inp_g_sc, secp256k1_ecmult_multi_callback cb, void *cbdata, size_t n_points, size_t cb_offset) {
    const size_t scratch_checkpoint = secp256k1_scratch_checkpoint(error_callback, scratch);
    /* Use 2(n+1) with the endomorphism, when calculating batch
     * sizes. The reason for +1 is that we add the G scalar to the list of
     * other scalars. */
    size_t entries = 2*n_points + 2;
    secp256k1_ge *points;
    secp256k1_scalar *scalars;
    secp256k1_gej *buckets;
    struct secp256k1_pippenger_state *state_space;
    size_t idx = 0;
    size_t point_idx = 0;
    int bucket_window;

    secp256k1_gej_set_infinity(r);
    if (inp_g_sc == NULL && n_points == 0) {
        return 1;
    }
    bucket_window = secp256k1_pippenger_bucket_window(n_points);

    /* We allocate PIPPENGER_SCRATCH_OBJECTS objects on the scratch space. If
     * these allocations change, make sure to update the
     * PIPPENGER_SCRATCH_OBJECTS constant and pippenger_scratch_size
     * accordingly. */
    points = (secp256k1_ge *) secp256k1_scratch_alloc(error_callback, scratch, entries * sizeof(*points));
    scalars = (secp256k1_scalar *) secp256k1_scratch_alloc(error_callback, scratch, entries * sizeof(*scalars));
    state_space = (struct secp256k1_pippenger_state *) secp256k1_scratch_alloc(error_callback, scratch, sizeof(*state_space));
    if (points == NULL || scalars == NULL || state_space == NULL) {
        secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
        return 0;
    }
    state_space->ps = (struct secp256k1_pippenger_point_state *) secp256k1_scratch_alloc(error_callback, scratch, entries * sizeof(*state_space->ps));
    state_space->wnaf_na = (int *) secp256k1_scratch_alloc(error_callback, scratch, entries*(WNAF_SIZE(bucket_window+1)) * sizeof(int));
    buckets = (secp256k1_gej *) secp256k1_scratch_alloc(error_callback, scratch, ((size_t)1 << bucket_window) * sizeof(*buckets));
    if (state_space->ps == NULL || state_space->wnaf_na == NULL || buckets == NULL) {
        secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
        return 0;
    }

    if (inp_g_sc != NULL) {
        scalars[0] = *inp_g_sc;
        points[0] = secp256k1_ge_const_g;
        idx++;
        secp256k1_ecmult_endo_split(&scalars[0], &scalars[1], &points[0], &points[1]);
        idx++;
    }

    while (point_idx < n_points) {
        if (!cb(&scalars[idx], &points[idx], point_idx + cb_offset, cbdata)) {
            secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
            return 0;
        }
        idx++;
        secp256k1_ecmult_endo_split(&scalars[idx - 1], &scalars[idx], &points[idx - 1], &points[idx]);
        idx++;
        point_idx++;
    }

    secp256k1_ecmult_pippenger_wnaf(buckets, bucket_window, state_space, r, scalars, points, idx);
    secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
    return 1;
}